

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  Error EVar6;
  int iVar7;
  CodeBuilder *pCVar8;
  anon_union_8_2_78723da6_for_MemData_2 *paVar9;
  Zone *this_00;
  undefined4 extraout_var;
  undefined8 *puVar10;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *paVar11;
  undefined4 extraout_var_00;
  uint uVar12;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *in_RCX;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *in_RDX;
  uint in_ESI;
  size_t in_RDI;
  uint *in_R8;
  uint *in_R9;
  Operand *opArray_3;
  CBInst *node_1;
  Error err_1;
  CBLabel *jTarget;
  Operand *opArray_1;
  CBJump *node;
  StringBuilderTmp<256UL> sb;
  Error err;
  Detail instDetail;
  Operand opArray [4];
  uint32_t kErrorsAndSpecialCases;
  uint32_t opCount;
  char *inlineComment;
  uint32_t options;
  uint32_t i_1;
  uint32_t opCount_2;
  Operand *opArray_4;
  uint32_t i;
  uint32_t opCount_1;
  Operand *opArray_2;
  size_t allocatedSize_1;
  size_t allocatedSize;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  undefined4 in_stack_fffffffffffff830;
  Error in_stack_fffffffffffff834;
  CBNode *in_stack_fffffffffffff838;
  CodeBuilder *in_stack_fffffffffffff840;
  CodeEmitter *in_stack_fffffffffffff848;
  StringBuilder *in_stack_fffffffffffff850;
  StringBuilder *in_stack_fffffffffffff858;
  undefined8 *puVar13;
  uint32_t in_stack_fffffffffffff860;
  undefined8 in_stack_fffffffffffff870;
  uint32_t id;
  CBLabel **in_stack_fffffffffffff878;
  CodeBuilder *pCVar14;
  bool local_756;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  ZoneHeap *in_stack_fffffffffffff8c8;
  undefined1 *local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined1 local_6d8 [268];
  Error local_5cc;
  undefined1 local_5c8 [4];
  uint local_5c4;
  undefined8 local_5c0;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_5b8;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_5b0;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_5a8;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined4 local_578;
  uint local_574;
  CodeBuilder *local_570;
  uint local_564;
  uint *local_560;
  uint *local_558;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_550;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_548;
  uint local_53c;
  Error local_52c;
  undefined4 local_528;
  undefined4 local_524;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_4e0;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_4d0;
  undefined8 *local_4c0;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  uint local_4a0;
  undefined1 *local_498;
  undefined1 **local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 **local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 **local_450;
  undefined1 **local_448;
  uint local_42c;
  long local_428;
  long *local_420;
  uint *local_418;
  undefined8 *local_410;
  uint *local_408;
  undefined8 *local_400;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_3f8;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_3f0;
  anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *local_3e8;
  char *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  uint local_128;
  uint local_110;
  
  id = (uint32_t)((ulong)in_stack_fffffffffffff870 >> 0x20);
  iVar7 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  local_564 = *(uint *)(in_RDI + 0x3c) | *(uint *)(in_RDI + 0x38);
  local_570 = *(CodeBuilder **)(in_RDI + 0x48);
  local_574 = (uint)(((in_RDX->offsetLo32 & 7) == 0 ^ 0xffU) & 1) +
              (uint)(((in_RCX->offsetLo32 & 7) == 0 ^ 0xffU) & 1) +
              (uint)(((*in_R8 & 7) == 0 ^ 0xffU) & 1) + (uint)(((*in_R9 & 7) == 0 ^ 0xffU) & 1);
  local_578 = 3;
  local_560 = in_R9;
  local_558 = in_R8;
  local_550 = in_RCX;
  local_548 = in_RDX;
  local_53c = in_ESI;
  if ((local_564 & 3) != 0) {
    if (*(int *)(in_RDI + 0x2c) != 0) {
      return *(Error *)(in_RDI + 0x2c);
    }
    if ((local_564 & 2) != 0) {
      local_4e0 = &local_5b8;
      local_5b8 = *in_RDX;
      local_5b0 = in_RDX[1];
      local_4d0 = &local_5a8;
      local_5a8 = *in_RCX;
      local_5a0 = in_RCX[1];
      local_4c0 = &local_598;
      local_598 = *(undefined8 *)in_R8;
      local_590 = *(undefined8 *)(in_R8 + 2);
      local_4b0 = &local_588;
      local_588 = *(undefined8 *)in_R9;
      local_580 = *(undefined8 *)(in_R9 + 2);
      local_4a8 = (undefined8 *)(in_RDI + 0x40);
      local_498 = local_5c8;
      local_5c0 = *local_4a8;
      local_4a0 = local_564;
      local_5c4 = local_564;
      local_5cc = Inst::validate((uint32_t)in_stack_fffffffffffff838,
                                 (Detail *)
                                 CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                                 (Operand_ *)
                                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),0);
      if (local_5cc != 0) {
        local_6f8 = local_6d8;
        local_6d8[0] = 0;
        local_6f0 = 0;
        local_6e8 = 0x100;
        local_6e0 = 0;
        local_480 = &local_6f8;
        local_458 = DebugUtils::errorAsString(in_stack_fffffffffffff834);
        local_460 = 0xffffffffffffffff;
        local_450 = &local_6f8;
        StringBuilder::_opString
                  (in_stack_fffffffffffff858,(uint32_t)((ulong)in_stack_fffffffffffff850 >> 0x20),
                   (char *)in_stack_fffffffffffff848,(size_t)in_stack_fffffffffffff840);
        local_470 = ": ";
        local_478 = 0xffffffffffffffff;
        local_468 = &local_6f8;
        StringBuilder::_opString
                  (in_stack_fffffffffffff858,(uint32_t)((ulong)in_stack_fffffffffffff850 >> 0x20),
                   (char *)in_stack_fffffffffffff848,(size_t)in_stack_fffffffffffff840);
        Logging::formatInstruction
                  (in_stack_fffffffffffff850,(uint32_t)((ulong)in_stack_fffffffffffff848 >> 0x20),
                   &in_stack_fffffffffffff840->super_CodeEmitter,
                   (uint32_t)((ulong)in_stack_fffffffffffff838 >> 0x20),
                   (Detail *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                   (Operand_ *)CONCAT44(in_stack_fffffffffffff82c,local_574),
                   in_stack_fffffffffffff860);
        local_448 = &local_6f8;
        local_52c = CodeEmitter::setLastError
                              (in_stack_fffffffffffff848,
                               (Error)((ulong)in_stack_fffffffffffff840 >> 0x20),
                               (char *)in_stack_fffffffffffff838);
        StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x221559);
        return local_52c;
      }
      local_564 = local_564 & 0xfffffffd;
      local_5cc = 0;
    }
  }
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  local_42c = local_53c;
  if ((local_53c < 0x113) || (local_756 = true, 0x132 < local_53c)) {
    local_756 = 0x175 < local_53c && local_53c < 0x179;
  }
  if (local_756) {
    local_420 = (long *)(in_RDI + 0xd8);
    local_428 = (ulong)local_574 * 0x10 + 0x58;
    if (*local_420 == 0) {
      DebugUtils::assertionFailed(in_stack_fffffffffffffc30,iVar7,in_stack_fffffffffffffc20);
    }
    pCVar8 = (CodeBuilder *)
             ZoneHeap::_alloc(in_stack_fffffffffffff8c8,in_RDI,
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    uVar12 = local_53c;
    uVar4 = local_564;
    uVar3 = local_574;
    paVar9 = &(pCVar8->super_CodeEmitter)._none.field_0._mem.field_2;
    if (pCVar8 == (CodeBuilder *)0x0) {
      local_524 = 1;
      local_52c = CodeEmitter::setLastError
                            (in_stack_fffffffffffff848,
                             (Error)((ulong)in_stack_fffffffffffff840 >> 0x20),
                             (char *)in_stack_fffffffffffff838);
    }
    else {
      if (local_574 != 0) {
        paVar9->field_1 = *local_548;
        (pCVar8->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0._packed[0] =
             *(UInt64 *)(local_548 + 1);
      }
      if (1 < local_574) {
        (pCVar8->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0._mem.field_2.
        field_1 = *local_550;
        (pCVar8->super_CodeEmitter)._nativeGpArray = (Reg *)local_550[1];
      }
      if (2 < local_574) {
        (pCVar8->_cbBaseZone)._ptr = *(uint8_t **)local_558;
        (pCVar8->_cbBaseZone)._end = *(uint8_t **)(local_558 + 2);
      }
      if (3 < local_574) {
        (pCVar8->_cbBaseZone)._block = *(Block **)local_560;
        uVar2 = local_560[3];
        (pCVar8->_cbBaseZone)._blockSize = local_560[2];
        (pCVar8->_cbBaseZone)._blockAlignmentShift = uVar2;
      }
      (pCVar8->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)0x0;
      (pCVar8->super_CodeEmitter)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
      (pCVar8->super_CodeEmitter)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
      *(undefined1 *)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress = 1;
      *(undefined1 *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 1) = 0;
      *(short *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
           (short)*(undefined4 *)(in_RDI + 0x184);
      *(undefined4 *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 4) =
           *(undefined4 *)(in_RDI + 0x180);
      (pCVar8->super_CodeEmitter)._code = (CodeHolder *)0x0;
      (pCVar8->super_CodeEmitter)._nextEmitter = (CodeEmitter *)0x0;
      (pCVar8->super_CodeEmitter)._type = '\0';
      (pCVar8->super_CodeEmitter)._destroyed = '\0';
      (pCVar8->super_CodeEmitter)._finalized = '\0';
      (pCVar8->super_CodeEmitter)._reserved = '\0';
      (pCVar8->super_CodeEmitter)._lastError = 0;
      pCVar14 = pCVar8;
      memset(&(pCVar8->super_CodeEmitter)._privateData,0,8);
      *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
           *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | 4;
      uVar12 = uVar12 & 0xffff;
      (pCVar8->super_CodeEmitter)._type = (char)uVar12;
      (pCVar8->super_CodeEmitter)._destroyed = (char)(uVar12 >> 8);
      (pCVar8->super_CodeEmitter)._finalized = (char)(uVar12 >> 0x10);
      (pCVar8->super_CodeEmitter)._reserved = (char)(uVar12 >> 0x18);
      (pCVar8->super_CodeEmitter)._lastError = uVar4;
      *(char *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 1) = (char)uVar3;
      (pCVar8->super_CodeEmitter)._extraReg = (RegOnly)paVar9;
      for (local_110 = 0;
          local_110 < *(byte *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 1);
          local_110 = local_110 + 1) {
        if ((*(uint *)((long)(pCVar8->super_CodeEmitter)._extraReg + (ulong)local_110 * 0x10) & 7)
            == 2) goto LAB_00221b58;
      }
      local_110 = 0xff;
LAB_00221b58:
      *(char *)&(pCVar8->super_CodeEmitter)._globalOptions = (char)local_110;
      (pCVar14->super_CodeEmitter)._inlineComment = (char *)0x0;
      (pCVar14->super_CodeEmitter)._none.field_0._packed[0] = (UInt64)0x0;
      uVar1 = *(undefined8 *)(in_RDI + 0x40);
      (pCVar8->super_CodeEmitter)._privateData = (int)uVar1;
      (pCVar8->super_CodeEmitter)._globalHints = (int)((ulong)uVar1 >> 0x20);
      *(undefined4 *)(in_RDI + 0x40) = 0;
      *(undefined4 *)(in_RDI + 0x44) = 0;
      if ((local_564 & 0x10) == 0) {
        if (((paVar9->field_1).offsetLo32 & 7) == 4) {
          EVar6 = CodeBuilder::getCBLabel(pCVar14,in_stack_fffffffffffff878,id);
          if (EVar6 != 0) {
            EVar6 = CodeEmitter::setLastError
                              (in_stack_fffffffffffff848,
                               (Error)((ulong)in_stack_fffffffffffff840 >> 0x20),
                               (char *)in_stack_fffffffffffff838);
            return EVar6;
          }
        }
        else {
          local_564 = local_564 | 0x10;
        }
      }
      (pCVar8->super_CodeEmitter)._lastError = local_564;
      uVar5 = 0x20;
      if (local_53c == 0x11e) {
        uVar5 = 0x50;
      }
      *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
           *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | uVar5;
      (pCVar8->super_CodeEmitter)._inlineComment = (char *)0x0;
      (pCVar8->super_CodeEmitter)._none.field_0._packed[0] = (UInt64)0x0;
      if (local_53c == 0x11e) {
        *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
             *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | 0x40;
      }
      else if ((local_564 & 0x100) != 0) {
        *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) =
             *(ushort *)((long)&(pCVar8->super_CodeEmitter)._codeInfo._baseAddress + 2) | 0x40;
      }
      if (local_570 != (CodeBuilder *)0x0) {
        this_00 = (Zone *)(in_RDI + 0x98);
        pCVar14 = local_570;
        strlen((char *)local_570);
        iVar7 = Zone::dup(this_00,(int)pCVar14);
        local_570 = (CodeBuilder *)CONCAT44(extraout_var,iVar7);
        (pCVar8->super_CodeEmitter)._code = (CodeHolder *)local_570;
      }
      CodeBuilder::addNode(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_52c = 0;
    }
  }
  else {
    if (*(long *)(in_RDI + 0xd8) == 0) {
      DebugUtils::assertionFailed(in_stack_fffffffffffffc30,iVar7,in_stack_fffffffffffffc20);
    }
    puVar10 = (undefined8 *)
              ZoneHeap::_alloc(in_stack_fffffffffffff8c8,in_RDI,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    uVar4 = local_564;
    uVar3 = local_574;
    paVar11 = (anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 9);
    if (puVar10 == (undefined8 *)0x0) {
      local_528 = 1;
      local_52c = CodeEmitter::setLastError
                            (in_stack_fffffffffffff848,
                             (Error)((ulong)in_stack_fffffffffffff840 >> 0x20),
                             (char *)in_stack_fffffffffffff838);
    }
    else {
      if (local_574 != 0) {
        local_3e8 = local_548;
        *paVar11 = *local_548;
        *(anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 10) =
             local_548[1];
      }
      if (1 < local_574) {
        local_3f0 = (anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)
                    (puVar10 + 0xb);
        local_3f8 = local_550;
        *local_3f0 = *local_550;
        *(anon_struct_8_2_ecefb879_for_anon_union_8_2_78723da6_for_MemData_2_1 *)(puVar10 + 0xc) =
             local_550[1];
      }
      if (2 < local_574) {
        local_400 = puVar10 + 0xd;
        local_408 = local_558;
        *local_400 = *(undefined8 *)local_558;
        puVar10[0xe] = *(undefined8 *)(local_558 + 2);
      }
      if (3 < local_574) {
        local_410 = puVar10 + 0xf;
        local_418 = local_560;
        *local_410 = *(undefined8 *)local_560;
        puVar10[0x10] = *(undefined8 *)(local_560 + 2);
      }
      *puVar10 = 0;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 1;
      *(undefined1 *)((long)puVar10 + 0x11) = 0;
      *(short *)((long)puVar10 + 0x12) = (short)*(undefined4 *)(in_RDI + 0x184);
      *(undefined4 *)((long)puVar10 + 0x14) = *(undefined4 *)(in_RDI + 0x180);
      puVar10[3] = 0;
      puVar10[4] = 0;
      *(undefined4 *)(puVar10 + 5) = 0;
      *(undefined4 *)((long)puVar10 + 0x2c) = 0;
      puVar13 = puVar10;
      memset(puVar10 + 6,0,8);
      *(ushort *)((long)puVar13 + 0x12) = *(ushort *)((long)puVar13 + 0x12) | 4;
      *(uint *)(puVar13 + 5) = local_53c & 0xffff;
      *(uint *)((long)puVar13 + 0x2c) = uVar4;
      *(char *)((long)puVar13 + 0x11) = (char)uVar3;
      puVar13[8] = paVar11;
      for (local_128 = 0; local_128 < *(byte *)((long)puVar13 + 0x11); local_128 = local_128 + 1) {
        if ((*(uint *)(puVar13[8] + (ulong)local_128 * 0x10) & 7) == 2) goto LAB_00222434;
      }
      local_128 = 0xff;
LAB_00222434:
      *(char *)(puVar13 + 7) = (char)local_128;
      puVar10[6] = *(undefined8 *)(in_RDI + 0x40);
      *(undefined4 *)(in_RDI + 0x40) = 0;
      *(undefined4 *)(in_RDI + 0x44) = 0;
      if (local_570 != (CodeBuilder *)0x0) {
        in_stack_fffffffffffff838 = (CBNode *)(in_RDI + 0x98);
        in_stack_fffffffffffff840 = local_570;
        strlen((char *)local_570);
        iVar7 = Zone::dup((Zone *)in_stack_fffffffffffff838,(int)in_stack_fffffffffffff840);
        local_570 = (CodeBuilder *)CONCAT44(extraout_var_00,iVar7);
        puVar10[3] = local_570;
      }
      CodeBuilder::addNode(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_52c = 0;
    }
  }
  return local_52c;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter is in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}